

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# taggedptr.h
# Opt level: O0

void pbrt::detail::
     Dispatch<pbrt::Light::PDF_Le(pbrt::Interaction_const&,pbrt::Vector3<float>,float*,float*)const::__0&,void,pbrt::PointLight,pbrt::DistantLight,pbrt::ProjectionLight,pbrt::GoniometricLight,pbrt::SpotLight,pbrt::DiffuseAreaLight,pbrt::UniformInfiniteLight,pbrt::ImageInfiniteLight,pbrt::PortalImageInfiniteLight,void>
               (anon_class_32_4_38b71870 *func,void *ptr,int index)

{
  uint in_EDX;
  ProjectionLight *in_RDI;
  anon_class_32_4_38b71870 *unaff_retaddr;
  void *in_stack_ffffffffffffffd8;
  
  switch((anon_class_32_4_38b71870 *)(ulong)in_EDX) {
  case (anon_class_32_4_38b71870 *)0x0:
    const::$_0::operator()(unaff_retaddr,(PointLight *)in_RDI);
    break;
  case (anon_class_32_4_38b71870 *)0x1:
    const::$_0::operator()(unaff_retaddr,(DistantLight *)in_RDI);
    break;
  case (anon_class_32_4_38b71870 *)0x2:
    const::$_0::operator()(unaff_retaddr,in_RDI);
    break;
  case (anon_class_32_4_38b71870 *)0x3:
    const::$_0::operator()(unaff_retaddr,(GoniometricLight *)in_RDI);
    break;
  case (anon_class_32_4_38b71870 *)0x4:
    const::$_0::operator()(unaff_retaddr,(SpotLight *)in_RDI);
    break;
  case (anon_class_32_4_38b71870 *)0x5:
    const::$_0::operator()(unaff_retaddr,(DiffuseAreaLight *)in_RDI);
    break;
  case (anon_class_32_4_38b71870 *)0x6:
    const::$_0::operator()(unaff_retaddr,(UniformInfiniteLight *)in_RDI);
    break;
  case (anon_class_32_4_38b71870 *)0x7:
    const::$_0::operator()(unaff_retaddr,(ImageInfiniteLight *)in_RDI);
    break;
  default:
    Dispatch<pbrt::Light::PDF_Le(pbrt::Interaction_const&,pbrt::Vector3<float>,float*,float*)const::__0&,void,pbrt::PortalImageInfiniteLight>
              ((anon_class_32_4_38b71870 *)(ulong)in_EDX,in_stack_ffffffffffffffd8,0);
  }
  return;
}

Assistant:

PBRT_CPU_GPU R Dispatch(F &&func, const void *ptr, int index) {
    DCHECK_GE(index, 0);

    switch (index) {
    case 0:
        return func((const T0 *)ptr);
    case 1:
        return func((const T1 *)ptr);
    case 2:
        return func((const T2 *)ptr);
    case 3:
        return func((const T3 *)ptr);
    case 4:
        return func((const T4 *)ptr);
    case 5:
        return func((const T5 *)ptr);
    case 6:
        return func((const T6 *)ptr);
    case 7:
        return func((const T7 *)ptr);
    default:
        return Dispatch<F, R, Ts...>(func, ptr, index - 8);
    }
}